

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Status __thiscall
leveldb::Version::Get(Version *this,ReadOptions *options,LookupKey *k,string *value,GetStats *stats)

{
  Slice internal_key;
  Comparator *arg;
  char *in_RDI;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  Slice SVar1;
  Slice in_stack_00000000;
  _func_bool_void_ptr_int_FileMetaData_ptr *in_stack_00000020;
  State state;
  State *in_stack_fffffffffffffe98;
  code *this_00;
  Slice *in_stack_fffffffffffffea0;
  LookupKey *in_stack_fffffffffffffea8;
  byte bVar2;
  undefined7 in_stack_fffffffffffffff1;
  size_t sVar3;
  
  sVar3 = *(size_t *)(in_FS_OFFSET + 0x28);
  *in_R9 = 0;
  *(undefined4 *)(in_R9 + 1) = 0xffffffff;
  Get::State::State(in_stack_fffffffffffffe98);
  bVar2 = 0;
  LookupKey::internal_key(in_stack_fffffffffffffea8);
  arg = InternalKeyComparator::user_comparator((InternalKeyComparator *)in_stack_fffffffffffffe98);
  SVar1 = LookupKey::user_key(in_stack_fffffffffffffea8);
  this_00 = Get(leveldb::ReadOptions_const&,leveldb::LookupKey_const&,std::__cxx11::string*,leveldb
            ::Version::GetStats*)::State::Match(void*,int,leveldb::FileMetaData__;
  internal_key.data_._1_7_ = in_stack_fffffffffffffff1;
  internal_key.data_._0_1_ = bVar2;
  internal_key.size_ = sVar3;
  ForEachOverlapping((Version *)SVar1.data_,in_stack_00000000,internal_key,arg,in_stack_00000020);
  if ((bVar2 & 1) == 0) {
    Slice::Slice((Slice *)this_00);
    Slice::Slice((Slice *)this_00);
    Status::NotFound(in_stack_fffffffffffffea0,(Slice *)this_00);
  }
  else {
    Status::Status((Status *)SVar1.size_,(Status *)in_stack_fffffffffffffea0);
  }
  Get::State::~State((State *)this_00);
  if (*(size_t *)(in_FS_OFFSET + 0x28) == sVar3) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status Version::Get(const ReadOptions& options, const LookupKey& k,
                    std::string* value, GetStats* stats) {
  stats->seek_file = nullptr;
  stats->seek_file_level = -1;

  struct State {
    Saver saver;
    GetStats* stats;
    const ReadOptions* options;
    Slice ikey;
    FileMetaData* last_file_read;
    int last_file_read_level;

    VersionSet* vset;
    Status s;
    bool found;

    static bool Match(void* arg, int level, FileMetaData* f) {
      State* state = reinterpret_cast<State*>(arg);

      if (state->stats->seek_file == nullptr &&
          state->last_file_read != nullptr) {
        // We have had more than one seek for this read.  Charge the 1st file.
        state->stats->seek_file = state->last_file_read;
        state->stats->seek_file_level = state->last_file_read_level;
      }

      state->last_file_read = f;
      state->last_file_read_level = level;

      state->s = state->vset->table_cache_->Get(*state->options, f->number,
                                                f->file_size, state->ikey,
                                                &state->saver, SaveValue);
      if (!state->s.ok()) {
        state->found = true;
        return false;
      }
      switch (state->saver.state) {
        case kNotFound:
          return true;  // Keep searching in other files
        case kFound:
          state->found = true;
          return false;
        case kDeleted:
          return false;
        case kCorrupt:
          state->s =
              Status::Corruption("corrupted key for ", state->saver.user_key);
          state->found = true;
          return false;
      }

      // Not reached. Added to avoid false compilation warnings of
      // "control reaches end of non-void function".
      return false;
    }
  };

  State state;
  state.found = false;
  state.stats = stats;
  state.last_file_read = nullptr;
  state.last_file_read_level = -1;

  state.options = &options;
  state.ikey = k.internal_key();
  state.vset = vset_;

  state.saver.state = kNotFound;
  state.saver.ucmp = vset_->icmp_.user_comparator();
  state.saver.user_key = k.user_key();
  state.saver.value = value;

  ForEachOverlapping(state.saver.user_key, state.ikey, &state, &State::Match);

  return state.found ? state.s : Status::NotFound(Slice());
}